

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall EPoller::removeChannel(EPoller *this,ChannelPtr *channel)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  mapped_type *__a;
  LogStream *this_00;
  Logger local_1018;
  undefined1 local_3c [8];
  epoll_event event;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false> local_28;
  int local_1c;
  ChannelPtr *pCStack_18;
  int fd;
  ChannelPtr *channel_local;
  EPoller *this_local;
  
  pCStack_18 = channel;
  channel_local = (ChannelPtr *)this;
  peVar3 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      channel);
  local_1c = Channel::fd(peVar3);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
       ::find(&this->channels_,&local_1c);
  event.data = (epoll_data_t)
               std::
               unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
               ::end(&this->channels_);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false> *)
                     &event.data);
  if (!bVar1) {
    __assert_fail("channels_.find(fd) != channels_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                  ,0x53,"void EPoller::removeChannel(ChannelPtr)");
  }
  __a = std::
        unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
        ::operator[](&this->channels_,&local_1c);
  bVar1 = std::operator==(__a,channel);
  if (!bVar1) {
    __assert_fail("channels_[fd] == channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                  ,0x54,"void EPoller::removeChannel(ChannelPtr)");
  }
  std::
  unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
  ::erase(&this->channels_,&local_1c);
  memset(local_3c,0,0xc);
  peVar3 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      channel);
  local_3c._0_4_ = Channel::events(peVar3);
  local_3c._4_4_ = local_1c;
  iVar2 = epoll_ctl(this->epollfd_,2,local_1c,(epoll_event *)local_3c);
  if (iVar2 < 0) {
    Logger::Logger(&local_1018,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                   ,0x5c);
    this_00 = Logger::stream(&local_1018);
    LogStream::operator<<(this_00,"Error: epoll_del error");
    Logger::~Logger(&local_1018);
  }
  return;
}

Assistant:

void EPoller::removeChannel(ChannelPtr channel) {
    int fd = channel->fd();
    assert(channels_.find(fd) != channels_.end());
    assert(channels_[fd] == channel);

    channels_.erase(fd);
    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    if (epoll_ctl(epollfd_, EPOLL_CTL_DEL, fd, &event) < 0) {
        LOG << "Error: epoll_del error";
    } 
    // LOG << "Epoll DEL fd = " << fd;
}